

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy.h
# Opt level: O0

bool __thiscall
disruptor::SingleThreadedStrategy::HasAvailableCapacity
          (SingleThreadedStrategy *this,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          int64_t cursor,int required_capacity)

{
  long lVar1;
  pointer ppSVar2;
  int in_ECX;
  int64_t in_RSI;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *in_RDI;
  int64_t min_sequence;
  int64_t wrap_point;
  
  lVar1 = (long)(in_RDI->
                super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>).
                _M_impl.super__Vector_impl_data._M_finish +
          ((long)in_ECX -
          (long)(in_RDI->
                super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>).
                _M_impl.super__Vector_impl_data._M_start);
  if ((long)(in_RDI->
            super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage < lVar1) {
    ppSVar2 = (pointer)GetMinimumSequence(in_RDI,in_RSI);
    (in_RDI->super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppSVar2;
    if ((long)ppSVar2 < lVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool HasAvailableCapacity(const std::vector<Sequence*>& dependents,
                            int64_t cursor, int required_capacity = 1) {
    const int64_t wrap_point =
        last_claimed_sequence_ + required_capacity - buffer_size_;
    if (wrap_point > last_consumer_sequence_) {
      const int64_t min_sequence = GetMinimumSequence(dependents);
      last_consumer_sequence_ = min_sequence;
      if (wrap_point > min_sequence) return false;
    }
    return true;
  }